

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O3

bool __thiscall embree::cache_regression_test::run(cache_regression_test *this)

{
  __int_type_conflict _Var1;
  BarrierSys *this_00;
  uint uVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> threads;
  void *local_58;
  iterator iStack_50;
  opaque_thread_t **local_48;
  BarrierSys *local_40;
  thread_t local_38;
  
  LOCK();
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  uVar2 = getNumberOfLogicalThreads();
  uVar4 = (ulong)uVar2;
  local_40 = &this->barrier;
  iVar3._M_current = (opaque_thread_t **)(uVar4 + 1);
  BarrierSys::init(local_40,(EVP_PKEY_CTX *)iVar3._M_current);
  local_58 = (void *)0x0;
  iStack_50._M_current = (opaque_thread_t **)0x0;
  local_48 = (opaque_thread_t **)0x0;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      local_38 = createThread(thread_alloc,this,0,uVar5);
      iVar3._M_current = iStack_50._M_current;
      if (iStack_50._M_current == local_48) {
        std::vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>>::
        _M_realloc_insert<embree::opaque_thread_t*>
                  ((vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>> *)
                   &local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  this_00 = local_40;
  BarrierSys::wait(local_40,iVar3._M_current);
  BarrierSys::wait(this_00,iVar3._M_current);
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      embree::join(*(thread_t *)((long)local_58 + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  _Var1 = (this->numFailed).super___atomic_base<unsigned_long>._M_i;
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  return _Var1 == 0;
}

Assistant:

bool run ()
    {
      numFailed.store(0);

      size_t numThreads = getNumberOfLogicalThreads();
      barrier.init(numThreads+1);

      /* create threads */
      std::vector<thread_t> threads;
      for (size_t i=0; i<numThreads; i++)
        threads.push_back(createThread((thread_func)thread_alloc,this,0,i));

      /* run test */ 
      barrier.wait();
      barrier.wait();

      /* destroy threads */
      for (size_t i=0; i<numThreads; i++)
        join(threads[i]);

      return numFailed == 0;
    }